

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall Omega_h::get_curvature_metrics(Omega_h *this,Mesh *mesh,Real segment_angle)

{
  int iVar1;
  double dVar2;
  double dVar3;
  Int i_4;
  LO LVar4;
  Int IVar5;
  double *pdVar6;
  double *pdVar7;
  Int j;
  long lVar8;
  Vector<3> *pVVar9;
  undefined8 uVar10;
  bool bVar11;
  Int i;
  long lVar12;
  long lVar13;
  void *extraout_RDX;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  undefined4 uVar17;
  uint uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  Real a_1;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  Reals RVar29;
  ScopedTimer omega_h_scoped_function_timer;
  Matrix<2,_2> c;
  Matrix<3,_3> m;
  Vector<2> l;
  double local_4f8;
  Vector<2> c_9;
  double local_4d8;
  Vector<3> c_18;
  Matrix<2,_2> c_8;
  Write<double> out;
  Vector<3> c_17;
  char *local_448;
  Matrix<2,_3> m_q_inv;
  Matrix<2,_3> surf_frame;
  Matrix<3,_2> at;
  Write<signed_char> local_378;
  Write<double> local_368;
  Write<double> local_358;
  double local_348;
  double dStack_340;
  double local_338;
  double dStack_330;
  double local_328 [2];
  Vector<3> c_15;
  Vector<2> m_ews;
  Vector<3> n;
  SurfaceInfo local_2a0;
  double local_240;
  Write<signed_char> local_238;
  Matrix<3,_2> c_19;
  type m_q;
  SurfaceInfo surface_info;
  type f;
  SurfaceInfo local_f0;
  SurfaceInfo local_90;
  
  get_surface_info(&surface_info,mesh);
  LVar4 = Mesh::nverts(mesh);
  IVar5 = Mesh::dim(mesh);
  std::__cxx11::string::string((string *)&local_2a0,"",(allocator *)&f);
  Write<double>::Write(&out,LVar4 * (((IVar5 + 1) * IVar5) / 2),0.0,(string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  IVar5 = Mesh::dim(mesh);
  if (IVar5 == 3) {
    SurfaceInfo::SurfaceInfo(&f.surface_info,&surface_info);
    f.segment_angle = segment_angle;
    Write<double>::Write(&f.out,&out);
    if (((ulong)surface_info.surf_vert2vert.write_.shared_alloc_.alloc & 1) == 0) {
      uVar14 = (surface_info.surf_vert2vert.write_.shared_alloc_.alloc)->size;
    }
    else {
      uVar14 = (ulong)surface_info.surf_vert2vert.write_.shared_alloc_.alloc >> 3;
    }
    std::__cxx11::string::string
              ((string *)&c,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
               ,(allocator *)&local_348);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,":");
    std::__cxx11::to_string((string *)&at,0x54);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&at);
    begin_code("parallel_for",(char *)local_2a0.surf_vert2vert.write_.shared_alloc_.alloc);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&at);
    std::__cxx11::string::~string((string *)&m);
    std::__cxx11::string::~string((string *)&c);
    uVar15 = (uint)(uVar14 >> 2);
    if (0 < (int)uVar15) {
      entering_parallel = 1;
      SurfaceInfo::SurfaceInfo(&local_2a0,&f.surface_info);
      local_240 = f.segment_angle;
      Write<double>::Write(&local_238,(Write<signed_char> *)&f.out);
      entering_parallel = 0;
      lVar16 = 0;
      local_448 = "best_norm > EPSILON";
      for (uVar14 = 0; pdVar7 = (double *)&m, uVar14 != (uVar15 & 0x7fffffff); uVar14 = uVar14 + 1)
      {
        for (lVar8 = 0;
            m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] =
                 m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1],
            lVar8 != 3; lVar8 = lVar8 + 1) {
          m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[lVar8] =
               *(double *)
                ((long)local_2a0.surf_vert_IIs.write_.shared_alloc_.direct_ptr + lVar8 * 8 + lVar16)
          ;
        }
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
             m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2];
        uVar17 = 0;
        uVar19 = 0;
        pdVar6 = pdVar7;
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
            dVar27 = ABS(pdVar6[lVar12]);
            if (dVar27 <= (double)CONCAT44(uVar19,uVar17)) {
              dVar27 = (double)CONCAT44(uVar19,uVar17);
            }
            uVar17 = SUB84(dVar27,0);
            uVar19 = (undefined4)((ulong)dVar27 >> 0x20);
          }
          pdVar6 = pdVar6 + 2;
        }
        if ((double)CONCAT44(uVar19,uVar17) <= 1e-10) {
          pdVar7 = &local_348;
          for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
            for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
              uVar18 = 0x3ff00000;
              if (lVar8 != lVar12) {
                uVar18 = 0;
              }
              pdVar7[lVar12] = (double)((ulong)uVar18 << 0x20);
            }
            pdVar7 = pdVar7 + 2;
          }
          local_328[0] = 0.0;
          local_328[1] = 0.0;
        }
        else {
          m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
               m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0];
          m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
               m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2];
          m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] =
               m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2];
          for (lVar8 = 0;
              dVar3 = c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1],
              dVar2 = c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0],
              dVar23 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1],
              dVar27 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0],
              lVar8 != 2; lVar8 = lVar8 + 1) {
            m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_[0] =
                 m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[lVar8 * 2]
            ;
            m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_[1] =
                 m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                 [lVar8 * 2 + 1];
            for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
              surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_
              [lVar12] = m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.
                         array_[lVar12] / (double)CONCAT44(uVar19,uVar17);
            }
            c.super_Few<Omega_h::Vector<2>,_2>.array_[lVar8].super_Few<double,_2>.array_[0] =
                 surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_
                 [0];
            c.super_Few<Omega_h::Vector<2>,_2>.array_[lVar8].super_Few<double,_2>.array_[1] =
                 surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_
                 [1];
          }
          dVar24 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] +
                   c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
          dVar22 = (c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] *
                    c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] -
                   c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] *
                   c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0]) *
                   -4.0 + dVar24 * dVar24;
          if (5e-05 <= ABS(dVar22)) {
            if (dVar22 <= 0.0) {
              uVar10 = 0x119;
              local_448 = "nroots == 1 && roots_obj.mults[0] == 2";
LAB_002d6071:
              fail("assertion %s failed at %s +%d\n",local_448,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
                   ,uVar10);
            }
            dVar28 = SQRT(dVar22);
            dVar25 = dVar28;
            if (dVar22 < 0.0) {
              dVar25 = sqrt(dVar22);
              dVar28 = sqrt(dVar22);
            }
            dVar22 = (dVar24 - dVar28) * 0.5;
            c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1]._0_4_ =
                 SUB84(dVar22,0);
            c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
                 (dVar25 + dVar24) * 0.5;
            c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1]._4_4_ =
                 (int)((ulong)dVar22 >> 0x20);
            for (lVar8 = 0;
                c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
                     l.super_Few<double,_2>.array_[0],
                c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
                     l.super_Few<double,_2>.array_[1], lVar8 != 2; lVar8 = lVar8 + 1) {
              dVar22 = c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_
                       [lVar8];
              m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] = dVar27;
              m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] = dVar23;
              m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] = dVar2;
              m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] = dVar3;
              pVVar9 = (Vector<3> *)&m;
              for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 0x10) {
                ((Few<Omega_h::Vector<3>,_3> *)&pVVar9->super_Few<double,_3>)->array_[0].
                super_Few<double,_3>.array_[0] =
                     ((Few<Omega_h::Vector<3>,_3> *)&pVVar9->super_Few<double,_3>)->array_[0].
                     super_Few<double,_3>.array_[0] - dVar22;
                pVVar9 = pVVar9 + 1;
              }
              c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2];
              c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] =
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0];
              c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0];
              c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1];
              for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 8) {
                uVar10 = *(undefined8 *)
                          ((long)c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                                 array_ + lVar12);
                *(undefined8 *)
                 ((long)m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_ +
                 lVar12 * 2) = *(undefined8 *)
                                ((long)c.super_Few<Omega_h::Vector<2>,_2>.array_[0].
                                       super_Few<double,_2>.array_ + lVar12);
                *(undefined8 *)
                 ((long)m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_ +
                 lVar12 * 2 + 8) = uVar10;
              }
              auVar26._0_8_ =
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] *
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] +
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] *
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2];
              auVar26._8_8_ =
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] *
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] +
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] *
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0];
              auVar26 = sqrtpd(auVar26,auVar26);
              dVar25 = auVar26._0_8_;
              dVar28 = auVar26._8_8_;
              dVar24 = dVar25;
              if (dVar25 <= dVar28) {
                dVar24 = dVar28;
              }
              if (dVar24 <= 1e-10) {
                uVar10 = 0xd3;
                goto LAB_002d6071;
              }
              m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_[0] =
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                   [(ulong)(dVar28 < dVar25) * 2];
              m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_[1] =
                   m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                   [(ulong)(dVar28 < dVar25) * 2 + 1];
              for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
                c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar12] =
                     m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_
                     [lVar12] / dVar24;
              }
              surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[lVar8].super_Few<double,_2>.array_
              [0] = -c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
              surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[lVar8].super_Few<double,_2>.array_
              [1] = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
              l.super_Few<double,_2>.array_[lVar8] = dVar22;
            }
          }
          else {
            for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
              for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
                uVar18 = 0x3ff00000;
                if (lVar8 != lVar12) {
                  uVar18 = 0;
                }
                pdVar7[lVar12] = (double)((ulong)uVar18 << 0x20);
              }
              pdVar7 = pdVar7 + 2;
            }
            surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[1].super_Few<double,_2>.array_[0] =
                 m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2];
            surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[1].super_Few<double,_2>.array_[1] =
                 m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0];
            surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_[0] =
                 m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0];
            surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_[1] =
                 m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1];
            c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
                 dVar24 * 0.5;
            c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
                 dVar24 * 0.5;
          }
          local_338 = surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[1].super_Few<double,_2>.
                      array_[0];
          dStack_330 = surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[1].super_Few<double,_2>.
                       array_[1];
          local_348 = surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.
                      array_[0];
          dStack_340 = surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.
                       array_[1];
          for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
            m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[lVar8] =
                 c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar8] *
                 (double)CONCAT44(uVar19,uVar17);
          }
          local_328[0] = m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]
          ;
          local_328[1] = m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]
          ;
        }
        pdVar7 = (double *)&m;
        pVVar9 = (Vector<3> *)&at;
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          m_ews.super_Few<double,_2>.array_[lVar8] =
               (local_328[lVar8] / local_240) * (local_328[lVar8] / local_240);
        }
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          n.super_Few<double,_3>.array_[lVar8] =
               *(double *)
                ((long)local_2a0.surf_vert_normals.write_.shared_alloc_.direct_ptr +
                lVar8 * 8 + lVar16);
        }
        dVar23 = (double)((ulong)n.super_Few<double,_3>.array_[2] & 0x8000000000000000 |
                         0x3ff0000000000000);
        dVar27 = -1.0 / (n.super_Few<double,_3>.array_[2] + dVar23);
        m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] =
             n.super_Few<double,_3>.array_[0] * n.super_Few<double,_3>.array_[1] * dVar27;
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
             n.super_Few<double,_3>.array_[0] * dVar23 * n.super_Few<double,_3>.array_[0] * dVar27 +
             1.0;
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
             m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] * dVar23;
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] =
             -dVar23 * n.super_Few<double,_3>.array_[0];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] =
             n.super_Few<double,_3>.array_[1] * n.super_Few<double,_3>.array_[1] * dVar27 + dVar23;
        m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] =
             -n.super_Few<double,_3>.array_[1];
        for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 8) {
          uVar10 = *(undefined8 *)
                    ((long)m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_
                    + lVar8);
          *(undefined8 *)
           ((long)surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_
           + lVar8 * 2) =
               *(undefined8 *)
                ((long)m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_ +
                lVar8);
          *(undefined8 *)
           ((long)surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_
           + lVar8 * 2 + 8) = uVar10;
        }
        m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] =
             surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[2].super_Few<double,_2>.array_[0];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] =
             surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[2].super_Few<double,_2>.array_[1];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] =
             surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[1].super_Few<double,_2>.array_[0];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] =
             surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[1].super_Few<double,_2>.array_[1];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
             surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_[0];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
             surf_frame.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_[1];
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          dVar27 = m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                   [lVar8 * 2];
          dVar23 = m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                   [lVar8 * 2 + 1];
          c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] = dStack_340
          ;
          c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] = local_348;
          for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
            c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar12] =
                 c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar12]
                 * dVar27;
          }
          bVar11 = true;
          while (dVar2 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1]
                , dVar27 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_
                           [0], bVar11) {
            c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
                 dStack_330;
            c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
                 local_338;
            for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
              c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar12] =
                   c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_
                   [lVar12] * dVar23;
            }
            c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] = dVar2;
            c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] = dVar27;
            l.super_Few<double,_2>.array_[0] =
                 c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
            l.super_Few<double,_2>.array_[1] =
                 c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
            for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
              c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar12] =
                   c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_
                   [lVar12] + l.super_Few<double,_2>.array_[lVar12];
            }
            bVar11 = false;
          }
          m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[lVar8].super_Few<double,_2>.array_[0] =
               c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
          m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[lVar8].super_Few<double,_2>.array_[1] =
               c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
        }
        m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] =
             m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[2].super_Few<double,_2>.array_[0];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] =
             m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[2].super_Few<double,_2>.array_[1];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] =
             m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[1].super_Few<double,_2>.array_[0];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] =
             m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[1].super_Few<double,_2>.array_[1];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
             m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_[0];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
             m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_[1];
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          for (lVar12 = 0; lVar12 != 0x18; lVar12 = lVar12 + 8) {
            *(undefined8 *)
             ((long)((Few<Omega_h::Vector<3>,_2> *)&pVVar9->super_Few<double,_3>)->array_[0].
                    super_Few<double,_3>.array_ + lVar12) =
                 *(undefined8 *)((long)pdVar7 + lVar12 * 2);
          }
          pVVar9 = pVVar9 + 1;
          pdVar7 = pdVar7 + 1;
        }
        c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
             at.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[2];
        c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] =
             at.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_[0];
        c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
             at.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[0];
        c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
             at.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[1];
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          lVar12 = lVar8 * 0x18;
          l.super_Few<double,_2>.array_[0] =
               *(double *)((long)c.super_Few<Omega_h::Vector<2>,_2>.array_ + lVar12);
          l.super_Few<double,_2>.array_[1] =
               *(double *)((long)c.super_Few<Omega_h::Vector<2>,_2>.array_ + lVar12 + 8);
          local_4f8 = *(double *)((long)c.super_Few<Omega_h::Vector<2>,_2>.array_ + lVar12 + 0x10);
          c_18.super_Few<double,_3>.array_[0] =
               m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_[0];
          c_18.super_Few<double,_3>.array_[1] =
               m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[0].super_Few<double,_2>.array_[1];
          for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
            c_9.super_Few<double,_2>.array_[lVar12] =
                 c_18.super_Few<double,_3>.array_[lVar12] * l.super_Few<double,_2>.array_[0];
          }
          uVar17 = c_9.super_Few<double,_2>.array_[0]._0_4_;
          uVar19 = c_9.super_Few<double,_2>.array_[0]._4_4_;
          uVar20 = c_9.super_Few<double,_2>.array_[1]._0_4_;
          uVar21 = c_9.super_Few<double,_2>.array_[1]._4_4_;
          for (lVar12 = 1; lVar12 != 3; lVar12 = lVar12 + 1) {
            dVar27 = l.super_Few<double,_2>.array_[lVar12];
            c_18.super_Few<double,_3>.array_[0] =
                 m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                 [lVar12 * 2];
            c_18.super_Few<double,_3>.array_[1] =
                 m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                 [lVar12 * 2 + 1];
            for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
              c_9.super_Few<double,_2>.array_[lVar13] =
                   c_18.super_Few<double,_3>.array_[lVar13] * dVar27;
            }
            c_18.super_Few<double,_3>.array_[0] = (double)CONCAT44(uVar19,uVar17);
            c_18.super_Few<double,_3>.array_[1] = (double)CONCAT44(uVar21,uVar20);
            c_17.super_Few<double,_3>.array_[0] = c_9.super_Few<double,_2>.array_[0];
            c_17.super_Few<double,_3>.array_[1] = c_9.super_Few<double,_2>.array_[1];
            for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
              c_9.super_Few<double,_2>.array_[lVar13] =
                   c_18.super_Few<double,_3>.array_[lVar13] +
                   c_17.super_Few<double,_3>.array_[lVar13];
            }
            uVar17 = c_9.super_Few<double,_2>.array_[0]._0_4_;
            uVar19 = c_9.super_Few<double,_2>.array_[0]._4_4_;
            uVar20 = c_9.super_Few<double,_2>.array_[1]._0_4_;
            uVar21 = c_9.super_Few<double,_2>.array_[1]._4_4_;
          }
          *(undefined4 *)
           c_8.super_Few<Omega_h::Vector<2>,_2>.array_[lVar8].super_Few<double,_2>.array_ = uVar17;
          *(undefined4 *)
           ((long)c_8.super_Few<Omega_h::Vector<2>,_2>.array_[lVar8].super_Few<double,_2>.array_ + 4
           ) = uVar19;
          *(undefined4 *)
           (c_8.super_Few<Omega_h::Vector<2>,_2>.array_[lVar8].super_Few<double,_2>.array_ + 1) =
               uVar20;
          *(undefined4 *)
           ((long)c_8.super_Few<Omega_h::Vector<2>,_2>.array_[lVar8].super_Few<double,_2>.array_ +
           0xc) = uVar21;
        }
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
             c_8.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
             -c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] =
             -c_8.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] =
             c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          c_9.super_Few<double,_2>.array_[0] =
               m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[lVar8 * 2];
          c_9.super_Few<double,_2>.array_[1] =
               m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
               [lVar8 * 2 + 1];
          for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
            l.super_Few<double,_2>.array_[lVar12] =
                 c_9.super_Few<double,_2>.array_[lVar12] /
                 (c_8.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] *
                  c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] +
                 -c_8.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] *
                 c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1]);
          }
          c.super_Few<Omega_h::Vector<2>,_2>.array_[lVar8].super_Few<double,_2>.array_[0] =
               l.super_Few<double,_2>.array_[0];
          c.super_Few<Omega_h::Vector<2>,_2>.array_[lVar8].super_Few<double,_2>.array_[1] =
               l.super_Few<double,_2>.array_[1];
        }
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] =
             c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] =
             c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
             c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
             c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          dVar27 = m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                   [lVar8 * 2];
          dVar23 = m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                   [lVar8 * 2 + 1];
          l.super_Few<double,_2>.array_[0] =
               at.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[0];
          l.super_Few<double,_2>.array_[1] =
               at.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[1];
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            c_15.super_Few<double,_3>.array_[lVar12] =
                 l.super_Few<double,_2>.array_[lVar12] * dVar27;
          }
          l.super_Few<double,_2>.array_[0] =
               at.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_[0];
          l.super_Few<double,_2>.array_[1] =
               at.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_[1];
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            c_17.super_Few<double,_3>.array_[lVar12] =
                 l.super_Few<double,_2>.array_[lVar12] * dVar23;
          }
          local_4f8 = c_17.super_Few<double,_3>.array_[2];
          l.super_Few<double,_2>.array_[0] = c_17.super_Few<double,_3>.array_[0];
          l.super_Few<double,_2>.array_[1] = c_17.super_Few<double,_3>.array_[1];
          c_9.super_Few<double,_2>.array_[0] = c_15.super_Few<double,_3>.array_[0];
          c_9.super_Few<double,_2>.array_[1] = c_15.super_Few<double,_3>.array_[1];
          local_4d8 = c_15.super_Few<double,_3>.array_[2];
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            c_18.super_Few<double,_3>.array_[lVar12] =
                 c_9.super_Few<double,_2>.array_[lVar12] + l.super_Few<double,_2>.array_[lVar12];
          }
          c_15.super_Few<double,_3>.array_[0] = c_18.super_Few<double,_3>.array_[0];
          c_15.super_Few<double,_3>.array_[1] = c_18.super_Few<double,_3>.array_[1];
          c_15.super_Few<double,_3>.array_[2] = c_18.super_Few<double,_3>.array_[2];
          m_q.super_Few<Omega_h::Vector<3>,_2>.array_[lVar8].super_Few<double,_3>.array_[2] =
               c_18.super_Few<double,_3>.array_[2];
          m_q.super_Few<Omega_h::Vector<3>,_2>.array_[lVar8].super_Few<double,_3>.array_[0] =
               c_18.super_Few<double,_3>.array_[0];
          m_q.super_Few<Omega_h::Vector<3>,_2>.array_[lVar8].super_Few<double,_3>.array_[1] =
               c_18.super_Few<double,_3>.array_[1];
        }
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
             m_ews.super_Few<double,_2>.array_[0];
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] = 0.0;
        m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] = 0.0;
        m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] =
             m_ews.super_Few<double,_2>.array_[1];
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          dVar27 = m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                   [lVar8 * 2];
          dVar23 = m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                   [lVar8 * 2 + 1];
          c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
               m_q.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[2];
          c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
               m_q.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[0];
          c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
               m_q.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[1];
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            c_18.super_Few<double,_3>.array_[lVar12] =
                 c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar12] *
                 dVar27;
          }
          c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
               m_q.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_[2];
          c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
               m_q.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_[0];
          c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
               m_q.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_[1];
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            c_9.super_Few<double,_2>.array_[lVar12] =
                 c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar12] *
                 dVar23;
          }
          c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] = local_4d8;
          c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
               c_9.super_Few<double,_2>.array_[0];
          c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
               c_9.super_Few<double,_2>.array_[1];
          c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
               c_18.super_Few<double,_3>.array_[1];
          c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
               c_18.super_Few<double,_3>.array_[0];
          c_8.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
               c_18.super_Few<double,_3>.array_[2];
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            l.super_Few<double,_2>.array_[lVar12] =
                 c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar12]
                 + c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar12];
          }
          c_18.super_Few<double,_3>.array_[0] = l.super_Few<double,_2>.array_[0];
          c_18.super_Few<double,_3>.array_[1] = l.super_Few<double,_2>.array_[1];
          c_18.super_Few<double,_3>.array_[2] = local_4f8;
          c_19.super_Few<Omega_h::Vector<3>,_2>.array_[lVar8].super_Few<double,_3>.array_[2] =
               local_4f8;
          c_19.super_Few<Omega_h::Vector<3>,_2>.array_[lVar8].super_Few<double,_3>.array_[0] =
               l.super_Few<double,_2>.array_[0];
          c_19.super_Few<Omega_h::Vector<3>,_2>.array_[lVar8].super_Few<double,_3>.array_[1] =
               l.super_Few<double,_2>.array_[1];
        }
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          dVar27 = m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[lVar8].super_Few<double,_2>.
                   array_[0];
          dVar23 = m_q_inv.super_Few<Omega_h::Vector<2>,_3>.array_[lVar8].super_Few<double,_2>.
                   array_[1];
          c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
               c_19.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[2];
          c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
               c_19.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[0];
          c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
               c_19.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[1];
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            c_17.super_Few<double,_3>.array_[lVar12] =
                 c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar12] *
                 dVar27;
          }
          c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
               c_19.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_[2];
          c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
               c_19.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_[0];
          c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
               c_19.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_[1];
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            c_9.super_Few<double,_2>.array_[lVar12] =
                 c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar12] *
                 dVar23;
          }
          c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] = local_4d8;
          c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
               c_9.super_Few<double,_2>.array_[0];
          c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
               c_9.super_Few<double,_2>.array_[1];
          c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
               c_17.super_Few<double,_3>.array_[1];
          c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
               c_17.super_Few<double,_3>.array_[0];
          c_8.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
               c_17.super_Few<double,_3>.array_[2];
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            l.super_Few<double,_2>.array_[lVar12] =
                 c_8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar12]
                 + c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar12];
          }
          c_17.super_Few<double,_3>.array_[0] = l.super_Few<double,_2>.array_[0];
          c_17.super_Few<double,_3>.array_[1] = l.super_Few<double,_2>.array_[1];
          c_17.super_Few<double,_3>.array_[2] = local_4f8;
          m.super_Few<Omega_h::Vector<3>,_3>.array_[lVar8].super_Few<double,_3>.array_[2] =
               local_4f8;
          m.super_Few<Omega_h::Vector<3>,_3>.array_[lVar8].super_Few<double,_3>.array_[0] =
               l.super_Few<double,_2>.array_[0];
          m.super_Few<Omega_h::Vector<3>,_3>.array_[lVar8].super_Few<double,_3>.array_[1] =
               l.super_Few<double,_2>.array_[1];
        }
        iVar1 = *(int *)((long)local_2a0.surf_vert2vert.write_.shared_alloc_.direct_ptr + uVar14 * 4
                        );
        c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
             m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0];
        c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
             m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1];
        c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
             m.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2];
        c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] =
             m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0];
        for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
          *(double *)((long)local_238.shared_alloc_.direct_ptr + lVar8 * 8 + (long)(iVar1 * 6) * 8)
               = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar8];
        }
        lVar16 = lVar16 + 0x18;
      }
      get_curvature_metrics(Omega_h::Mesh*,double)::$_0::~__0((__0 *)&local_2a0);
    }
    ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
    SurfaceInfo::SurfaceInfo(&local_90,&surface_info);
    Write<double>::Write(&local_358,&out);
    get_curve_curvature_metrics<3>(&local_90,segment_angle,&local_358);
    Write<double>::~Write(&local_358);
    SurfaceInfo::~SurfaceInfo(&local_90);
    get_curvature_metrics(Omega_h::Mesh*,double)::$_0::~__0((__0 *)&f);
  }
  else {
    IVar5 = Mesh::dim(mesh);
    if (IVar5 == 2) {
      SurfaceInfo::SurfaceInfo(&local_f0,&surface_info);
      Write<double>::Write(&local_368,&out);
      get_curve_curvature_metrics<2>(&local_f0,segment_angle,&local_368);
      Write<double>::~Write(&local_368);
      SurfaceInfo::~SurfaceInfo(&local_f0);
    }
  }
  Write<double>::Write(&local_378,(Write<signed_char> *)&out);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_378);
  Write<double>::~Write((Write<double> *)&local_378);
  Write<double>::~Write(&out);
  SurfaceInfo::~SurfaceInfo(&surface_info);
  RVar29.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar29.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar29.write_.shared_alloc_;
}

Assistant:

Reals get_curvature_metrics(Mesh* mesh, Real segment_angle) {
  auto surface_info = get_surface_info(mesh);
  auto out = Write<Real>(mesh->nverts() * symm_ncomps(mesh->dim()), 0.0);
  if (mesh->dim() == 3) {
    /* this algorithm creates degenerate metrics that only specify size in
       the two tangential directions to mesh surfaces */
    auto f = OMEGA_H_LAMBDA(LO const surf_vert) {
      auto const II = get_symm<2>(surface_info.surf_vert_IIs, surf_vert);
      auto const II_decomp = decompose_eigen(II);
      Vector<2> m_ews;
      for (Int i = 0; i < 2; ++i) {
        m_ews[i] = square(II_decomp.l[i] / segment_angle);
      }
      auto const n = get_vector<3>(surface_info.surf_vert_normals, surf_vert);
      auto const frame = form_ortho_basis(n);
      Matrix<3, 2> surf_frame_t;
      surf_frame_t[0] = frame[1];
      surf_frame_t[1] = frame[2];
      auto const surf_frame = transpose(surf_frame_t);
      auto const m_q_inv = II_decomp.q * surf_frame;
      auto const m_q = pseudo_invert(m_q_inv);
      auto const m = m_q * diagonal(m_ews) * m_q_inv;
      auto const vert = surface_info.surf_vert2vert[surf_vert];
      set_symm(out, vert, m);
    };
    parallel_for(surface_info.surf_vert2vert.size(), std::move(f));
    get_curve_curvature_metrics<3>(surface_info, segment_angle, out);
  } else if (mesh->dim() == 2) {
    get_curve_curvature_metrics<2>(surface_info, segment_angle, out);
  }
  return out;
}